

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

void ncnn::binary_op_vector_no_broadcast<ncnn::BinaryOp_x86_functor::binary_op_div>
               (float *ptr,float *ptr1,float *outptr,int size)

{
  undefined1 auVar1 [16];
  undefined8 local_e8;
  undefined8 uStack_e0;
  int local_ac;
  float *local_a0;
  undefined1 (*local_98) [16];
  undefined1 (*local_90) [16];
  __m128 _outp;
  __m128 _b;
  __m128 _p;
  int i;
  binary_op_div op;
  int size_local;
  float *outptr_local;
  float *ptr1_local;
  float *ptr_local;
  
  local_a0 = outptr;
  local_98 = (undefined1 (*) [16])ptr1;
  local_90 = (undefined1 (*) [16])ptr;
  for (local_ac = 0; local_ac + 3 < size; local_ac = local_ac + 4) {
    auVar1 = divps(*local_90,*local_98);
    local_e8 = auVar1._0_8_;
    uStack_e0 = auVar1._8_8_;
    *(undefined8 *)local_a0 = local_e8;
    *(undefined8 *)(local_a0 + 2) = uStack_e0;
    local_90 = local_90 + 1;
    local_98 = local_98 + 1;
    local_a0 = local_a0 + 4;
  }
  for (; local_ac < size; local_ac = local_ac + 1) {
    *local_a0 = *(float *)*local_90 / *(float *)*local_98;
    local_90 = (undefined1 (*) [16])(*local_90 + 4);
    local_98 = (undefined1 (*) [16])(*local_98 + 4);
    local_a0 = local_a0 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_no_broadcast(const float* ptr, const float* ptr1, float* outptr, int size)
{
    const Op op;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_p, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_p, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(*ptr, *ptr1);
        ptr += 1;
        ptr1 += 1;
        outptr += 1;
    }
}